

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

id gpt_sample_top_k_top_p_repeat
             (gpt_vocab *vocab,float *logits,int32_t *last_n_tokens_data,
             size_t last_n_tokens_data_size,int top_k,double top_p,double temp,int repeat_last_n,
             float repeat_penalty,mt19937 *rng)

{
  undefined8 uVar1;
  result_type rVar2;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> _Var3;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]whisper_examples_common_cpp:543:13)>
  *__comp;
  pointer ppVar4;
  double *pdVar5;
  ulong uVar6;
  id iVar7;
  size_type __new_size;
  ulong uVar8;
  ulong uVar9;
  __normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
  __i;
  int *piVar10;
  __normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
  _Var11;
  int iVar12;
  pair<double,_int> *kv_1;
  long lVar13;
  pointer ppVar14;
  bool bVar15;
  float fVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  double dVar19;
  double dVar20;
  double local_d8;
  vector<double,_std::allocator<double>_> probs;
  vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> logits_id;
  discrete_distribution<int> dist;
  vector<int,_std::allocator<int>_> last_n_tokens;
  
  uVar1 = *(undefined8 *)&vocab->field_0x58;
  std::vector<int,std::allocator<int>>::vector<int_const*,void>
            ((vector<int,std::allocator<int>> *)&last_n_tokens,last_n_tokens_data,
             last_n_tokens_data + last_n_tokens_data_size,(allocator_type *)&dist);
  iVar12 = (int)uVar1;
  if (temp <= 0.0) {
    fVar16 = *logits;
    uVar8 = 0;
    for (uVar9 = 1; iVar7 = (id)uVar8, (long)uVar9 < (long)iVar12; uVar9 = uVar9 + 1) {
      if (fVar16 < logits[uVar9]) {
        uVar8 = uVar9 & 0xffffffff;
        fVar16 = logits[uVar9];
      }
    }
  }
  else {
    logits_id.super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    logits_id.super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    logits_id.super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::reserve
              (&logits_id,(long)iVar12);
    __comp = (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]whisper_examples_common_cpp:543:13)>
              *)0x0;
    while( true ) {
      ppVar14 = logits_id.
                super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      ppVar4 = logits_id.
               super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      probs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)CONCAT44(probs.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                   .super__Vector_impl_data._M_start._4_4_,(int)__comp);
      if (iVar12 <= (int)__comp) break;
      if (repeat_last_n < 1) {
LAB_0012a08e:
        dist._M_param._M_prob.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish._0_4_ = (int)__comp;
        dist._M_param._M_prob.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)(double)(logits[(int)dist._M_param._M_prob.
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data._M_finish] *
                              (float)(1.0 / temp));
        std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>::
        emplace_back<std::pair<double,int>>
                  ((vector<std::pair<double,int>,std::allocator<std::pair<double,int>>> *)&logits_id
                   ,(pair<double,_int> *)&dist);
      }
      else {
        _Var3 = std::
                __find_if<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                          (last_n_tokens.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish + -(ulong)(uint)repeat_last_n,
                           last_n_tokens.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish,&probs);
        __comp = (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]whisper_examples_common_cpp:543:13)>
                  *)((ulong)probs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start & 0xffffffff);
        if (_Var3._M_current ==
            last_n_tokens.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish) goto LAB_0012a08e;
        fVar16 = logits[(int)probs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start] * (float)(1.0 / temp);
        if (0.0 <= logits[(int)probs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start]) {
          dist._M_param._M_prob.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)(double)(fVar16 / repeat_penalty);
          dist._M_param._M_prob.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish._0_4_ =
               (int)probs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
          std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>::
          emplace_back<std::pair<double,int>>
                    ((vector<std::pair<double,int>,std::allocator<std::pair<double,int>>> *)
                     &logits_id,(pair<double,_int> *)&dist);
        }
        else {
          dist._M_param._M_prob.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)(double)(fVar16 * repeat_penalty);
          dist._M_param._M_prob.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish._0_4_ =
               (int)probs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
          std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>::
          emplace_back<std::pair<double,int>>
                    ((vector<std::pair<double,int>,std::allocator<std::pair<double,int>>> *)
                     &logits_id,(pair<double,_int> *)&dist);
        }
      }
      __comp = (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]whisper_examples_common_cpp:543:13)>
                *)(ulong)((int)probs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start + 1);
    }
    __new_size = (size_type)top_k;
    lVar13 = __new_size * 0x10;
    if (1 < top_k) {
      uVar9 = __new_size - 2 >> 1;
      piVar10 = &logits_id.
                 super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar9].second;
      do {
        __comp = (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]whisper_examples_common_cpp:543:13)>
                  *)(ulong)(uint)*piVar10;
        std::
        __adjust_heap<__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>,long,std::pair<double,int>,__gnu_cxx::__ops::_Iter_comp_iter<gpt_sample_top_k_top_p_repeat(gpt_vocab_const&,float_const*,int_const*,unsigned_long,int,double,double,int,float,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>&)::__0>>
                  (SUB84(((pair<double,_int> *)(piVar10 + -2))->first,0),ppVar4,uVar9,__new_size);
        piVar10 = piVar10 + -4;
        bVar15 = uVar9 != 0;
        uVar9 = uVar9 - 1;
      } while (bVar15);
    }
    for (_Var11._M_current = ppVar4 + __new_size; _Var11._M_current < ppVar14;
        _Var11._M_current = _Var11._M_current + 1) {
      if (ppVar4->first <= (_Var11._M_current)->first && (_Var11._M_current)->first != ppVar4->first
         ) {
        std::
        __pop_heap<__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<gpt_sample_top_k_top_p_repeat(gpt_vocab_const&,float_const*,int_const*,unsigned_long,int,double,double,int,float,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>&)::__0>>
                  ((__normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
                    )ppVar4,ppVar4 + __new_size,_Var11,__comp);
      }
    }
    _Var11._M_current = ppVar4 + __new_size;
    for (; _Var11._M_current = _Var11._M_current + -1, 0x10 < lVar13; lVar13 = lVar13 + -0x10) {
      std::
      __pop_heap<__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<gpt_sample_top_k_top_p_repeat(gpt_vocab_const&,float_const*,int_const*,unsigned_long,int,double,double,int,float,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>&)::__0>>
                ((__normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
                  )ppVar4,_Var11,_Var11,__comp);
    }
    std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::resize
              (&logits_id,__new_size);
    dVar19 = -INFINITY;
    for (ppVar4 = logits_id.
                  super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppVar4 != logits_id.
                  super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; ppVar4 = ppVar4 + 1) {
      dVar20 = ppVar4->first;
      uVar17 = SUB84(dVar20,0);
      uVar18 = (undefined4)((ulong)dVar20 >> 0x20);
      if (dVar20 <= dVar19) {
        uVar17 = SUB84(dVar19,0);
        uVar18 = (undefined4)((ulong)dVar19 >> 0x20);
      }
      dVar19 = (double)CONCAT44(uVar18,uVar17);
    }
    probs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    probs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    probs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    std::vector<double,_std::allocator<double>_>::reserve
              (&probs,(long)logits_id.
                            super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)logits_id.
                            super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 4);
    ppVar4 = logits_id.
             super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    dVar20 = 0.0;
    for (ppVar14 = logits_id.
                   super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pdVar5 = probs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start, ppVar14 != ppVar4; ppVar14 = ppVar14 + 1) {
      dist._M_param._M_prob.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)exp(ppVar14->first - dVar19);
      std::vector<double,_std::allocator<double>_>::push_back(&probs,(value_type_conflict5 *)&dist);
      dVar20 = dVar20 + (double)dist._M_param._M_prob.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start;
    }
    for (; pdVar5 != probs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish; pdVar5 = pdVar5 + 1) {
      *pdVar5 = *pdVar5 / dVar20;
    }
    if (top_p < 1.0) {
      uVar8 = 0;
      uVar9 = (ulong)(uint)top_k;
      if (top_k < 1) {
        uVar9 = uVar8;
      }
      local_d8 = 0.0;
      do {
        if (uVar9 == uVar8) goto LAB_0012a2f9;
        local_d8 = local_d8 +
                   probs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar8];
        uVar8 = uVar8 + 1;
      } while (local_d8 < top_p);
      std::vector<double,_std::allocator<double>_>::resize(&probs,uVar8);
      std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::resize
                (&logits_id,uVar8);
LAB_0012a2f9:
      uVar8 = (ulong)((long)probs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)probs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start) >> 3;
      uVar6 = 0;
      uVar9 = uVar8 & 0xffffffff;
      if ((int)uVar8 < 1) {
        uVar9 = uVar6;
      }
      for (; uVar9 != uVar6; uVar6 = uVar6 + 1) {
        probs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar6] =
             probs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar6] * (1.0 / local_d8);
      }
    }
    std::discrete_distribution<int>::param_type::
    param_type<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
              (&dist._M_param,
               (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
               probs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,
               (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
               probs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish);
    rVar2 = std::discrete_distribution<int>::operator()(&dist,rng);
    iVar7 = logits_id.
            super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
            _M_impl.super__Vector_impl_data._M_start[rVar2].second;
    std::discrete_distribution<int>::param_type::~param_type(&dist._M_param);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&probs.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::
    ~_Vector_base(&logits_id.
                   super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                 );
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&last_n_tokens.super__Vector_base<int,_std::allocator<int>_>);
  return iVar7;
}

Assistant:

gpt_vocab::id gpt_sample_top_k_top_p_repeat(
        const gpt_vocab & vocab,
        const float * logits,
        const int32_t * last_n_tokens_data,
        size_t last_n_tokens_data_size,
        int    top_k,
        double top_p,
        double temp,
        int repeat_last_n,
        float repeat_penalty,
        std::mt19937 & rng) {

    int n_logits = vocab.id_to_token.size();

    const auto * plogits = logits;

    const auto last_n_tokens = std::vector<int32_t>(last_n_tokens_data, last_n_tokens_data + last_n_tokens_data_size);

    if (temp <= 0) {
        // select the token with the highest logit directly
        float max_logit = plogits[0];
        gpt_vocab::id max_id = 0;

        for (int i = 1; i < n_logits; ++i) {
            if (plogits[i] > max_logit) {
                max_logit = plogits[i];
                max_id = i;
            }
        }
        return max_id;
    }


    std::vector<std::pair<double, gpt_vocab::id>> logits_id;
    logits_id.reserve(n_logits);

    {
        const float scale = 1.0f/temp;
        for (int i = 0; i < n_logits; ++i) {
            // repetition penalty from ctrl paper (https://arxiv.org/abs/1909.05858)
            // credit https://github.com/facebookresearch/llama/compare/main...shawwn:llama:main
            if (repeat_last_n > 0 && std::find(last_n_tokens.end()-repeat_last_n, last_n_tokens.end(), i) != last_n_tokens.end()) {
                // if score < 0 then repetition penalty has to multiplied to reduce the previous token probability
                if (plogits[i] < 0.0f) {
                    logits_id.push_back(std::make_pair(plogits[i]*scale*repeat_penalty, i));
                } else {
                    logits_id.push_back(std::make_pair(plogits[i]*scale/repeat_penalty, i));
                }
            } else {
                logits_id.push_back(std::make_pair(plogits[i]*scale, i));
            }
        }
    }

    // find the top K tokens
    std::partial_sort(
            logits_id.begin(),
            logits_id.begin() + top_k, logits_id.end(),
            [](const std::pair<double, gpt_vocab::id> & a, const std::pair<double, gpt_vocab::id> & b) {
        return a.first > b.first;
    });

    logits_id.resize(top_k);

    double maxl = -INFINITY;
    for (const auto & kv : logits_id) {
        maxl = std::max(maxl, kv.first);
    }

    // compute probs for the top K tokens
    std::vector<double> probs;
    probs.reserve(logits_id.size());

    double sum = 0.0;
    for (const auto & kv : logits_id) {
        double p = exp(kv.first - maxl);
        probs.push_back(p);
        sum += p;
    }

    // normalize the probs
    for (auto & p : probs) {
        p /= sum;
    }

    if (top_p < 1.0f) {
        double cumsum = 0.0f;
        for (int i = 0; i < top_k; i++) {
            cumsum += probs[i];
            if (cumsum >= top_p) {
                top_k = i + 1;
                probs.resize(top_k);
                logits_id.resize(top_k);
                break;
            }
        }

        cumsum = 1.0/cumsum;
        for (int i = 0; i < (int) probs.size(); i++) {
            probs[i] *= cumsum;
        }
    }

//    printf("\n");
//    for (int i = 0; i < (int) probs.size(); i++) {
//    for (int i = 0; i < 10; i++) {
//        printf("%d: '%s' %f\n", i, vocab.id_to_token.at(logits_id[i].second).c_str(), probs[i]);
//    }

    std::discrete_distribution<> dist(probs.begin(), probs.end());
    int idx = dist(rng);

    return logits_id[idx].second;

}